

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_value_type.c
# Opt level: O0

value value_from_map(value v,value *tuples,size_t size)

{
  long in_RDX;
  void *in_RSI;
  value in_RDI;
  size_t bytes;
  size_t current_size;
  value in_stack_ffffffffffffffb8;
  value local_8;
  
  local_8 = in_RDI;
  if (((in_RDI != (value)0x0) && (in_RSI != (void *)0x0)) && (in_RDX != 0)) {
    value_size(in_stack_ffffffffffffffb8);
    local_8 = value_from((value)(in_RDX << 3),in_RSI,(size_t)in_RDI);
  }
  return local_8;
}

Assistant:

value value_from_map(value v, const value *tuples, size_t size)
{
	if (v != NULL && tuples != NULL && size > 0)
	{
		size_t current_size = value_size(v);

		size_t bytes = sizeof(const value) * size;

		return value_from(v, tuples, (bytes <= current_size) ? bytes : current_size);
	}

	return v;
}